

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_suite.cpp
# Opt level: O0

void parser_suite::parse_integer(void)

{
  bool bVar1;
  uchar (*in_RDX) [1];
  uchar (*input_00) [1];
  uchar (*input_01) [2];
  uchar (*input_02) [3];
  uchar (*input_03) [5];
  uchar (*input_04) [9];
  undefined4 local_1c4;
  type_conflict4 local_1c0 [2];
  undefined1 local_1b8 [8];
  basic_variable<std::allocator<char>_> result_5;
  undefined8 local_180;
  value_type input_5 [9];
  undefined1 local_168 [8];
  basic_variable<std::allocator<char>_> result_4;
  undefined4 local_12c;
  undefined1 local_128;
  value_type input_4 [5];
  undefined1 local_118 [8];
  basic_variable<std::allocator<char>_> result_3;
  value_type input_3 [3];
  undefined1 local_d8 [8];
  basic_variable<std::allocator<char>_> result_2;
  type_conflict4 tStack_a0;
  value_type input_2 [2];
  undefined1 local_98 [8];
  basic_variable<std::allocator<char>_> result_1;
  undefined4 local_60;
  type_conflict4 tStack_5c;
  value_type input_1 [1];
  undefined1 local_48 [8];
  basic_variable<std::allocator<char>_> result;
  bintoken local_9 [8];
  value_type input [1];
  
  local_9[0] = (bintoken)0x2;
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_48,local_9,in_RDX);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                    ((basic_variable<std::allocator<char>_> *)local_48);
  boost::detail::test_impl
            ("result.is<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x3e,"void parser_suite::parse_integer()",bVar1);
  tStack_5c = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_48);
  local_60 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x3f,"void parser_suite::parse_integer()",&stack0xffffffffffffffa4,&local_60);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_48);
  result_1.storage._47_1_ = 0xfe;
  trial::protocol::bintoken::parse<unsigned_char[1],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_98,
             (bintoken *)&result_1.storage.field_0x2f,input_00);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<int>
                    ((basic_variable<std::allocator<char>_> *)local_98);
  boost::detail::test_impl
            ("result.is<int>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x45,"void parser_suite::parse_integer()",bVar1);
  tStack_a0 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                        ((basic_variable<std::allocator<char>_> *)local_98);
  result_2.storage._44_4_ = 0xfffffffe;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","-2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x46,"void parser_suite::parse_integer()",&stack0xffffffffffffff60,
             &result_2.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_98);
  result_2.storage._42_2_ = 0x2a0;
  trial::protocol::bintoken::parse<unsigned_char[2],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_d8,
             (bintoken *)&result_2.storage.field_0x2a,input_01);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<signed_char>
                    ((basic_variable<std::allocator<char>_> *)local_d8);
  boost::detail::test_impl
            ("result.is<std::int8_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x4c,"void parser_suite::parse_integer()",bVar1);
  _input_3 = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                       ((basic_variable<std::allocator<char>_> *)local_d8);
  result_3.storage._44_4_ = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x4d,"void parser_suite::parse_integer()",input_3,&result_3.storage.field_0x2c);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_d8);
  result_3.storage._42_1_ = 0;
  result_3.storage._40_2_ = 0x2b2;
  trial::protocol::bintoken::parse<unsigned_char[3],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_118,
             (bintoken *)&result_3.storage.field_0x28,input_02);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<short>
                    ((basic_variable<std::allocator<char>_> *)local_118);
  boost::detail::test_impl
            ("result.same<std::int16_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x53,"void parser_suite::parse_integer()",bVar1);
  register0x00000000 =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                 ((basic_variable<std::allocator<char>_> *)local_118);
  input_4[0] = '\x02';
  input_4[1] = '\0';
  input_4[2] = '\0';
  input_4[3] = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x54,"void parser_suite::parse_integer()",input_4 + 4,input_4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_118);
  local_128 = 0;
  local_12c = 0x2c4;
  trial::protocol::bintoken::parse<unsigned_char[5],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_168,(bintoken *)&local_12c,input_03);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<int>
                    ((basic_variable<std::allocator<char>_> *)local_168);
  boost::detail::test_impl
            ("result.same<std::int32_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x5a,"void parser_suite::parse_integer()",bVar1);
  register0x00000000 =
       trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                 ((basic_variable<std::allocator<char>_> *)local_168);
  input_5[4] = '\x02';
  input_5[5] = '\0';
  input_5[6] = '\0';
  input_5[7] = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x5b,"void parser_suite::parse_integer()",input_5 + 8,input_5 + 4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_168);
  input_5[0] = '\0';
  local_180 = 0x2d6;
  trial::protocol::bintoken::parse<unsigned_char[9],std::allocator<char>>
            ((basic_variable<std::allocator<char>_> *)local_1b8,(bintoken *)&local_180,input_04);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::same<long>
                    ((basic_variable<std::allocator<char>_> *)local_1b8);
  boost::detail::test_impl
            ("result.same<std::int64_t>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x61,"void parser_suite::parse_integer()",bVar1);
  local_1c0[0] = trial::dynamic::basic_variable<std::allocator<char>_>::value<int>
                           ((basic_variable<std::allocator<char>_> *)local_1b8);
  local_1c4 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("result.value<int>()","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/parse_suite.cpp"
             ,0x62,"void parser_suite::parse_integer()",local_1c0,&local_1c4);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_1b8);
  return;
}

Assistant:

void parse_integer()
{
    // small-pos-int
    {
        const value_type input[] = { 0x02 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<int>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // small-neg-int
    {
        const value_type input[] = { 0xFE };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<int>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), -2);
    }
    // int8
    {
        const value_type input[] = { bintoken::token::code::int8, 0x02 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.is<std::int8_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // int16
    {
        const value_type input[] = { bintoken::token::code::int16, 0x02, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<std::int16_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // int32
    {
        const value_type input[] = { bintoken::token::code::int32, 0x02, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<std::int32_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
    // int64
    {
        const value_type input[] = { bintoken::token::code::int64, 0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00 };
        auto result = bintoken::parse(input);
        TRIAL_PROTOCOL_TEST(result.same<std::int64_t>());
        TRIAL_PROTOCOL_TEST_EQUAL(result.value<int>(), 2);
    }
}